

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_def_io.c
# Opt level: O2

int32 parse_rem(char ***attrib,uint32 *tmat,uint32 *state,uint32 *n_state,uint32 n_read)

{
  uint uVar1;
  uint32 uVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = 0;
  pcVar3 = strtok((char *)0x0," \t");
  mk_attrib_list(pcVar3);
  *attrib = mk_attrib_list::attrib_list;
  pcVar3 = strtok((char *)0x0," \t");
  uVar2 = atoi(pcVar3);
  *tmat = uVar2;
  uVar1 = *n_state;
  while ((uVar5 = (ulong)uVar1, uVar1 != uVar4 &&
         (pcVar3 = strtok((char *)0x0," \t"), uVar5 = uVar4, pcVar3 != (char *)0x0))) {
    uVar2 = 0xffffffff;
    if (*pcVar3 != 'N') {
      uVar2 = atoi(pcVar3);
    }
    state[uVar4] = uVar2;
    uVar4 = uVar4 + 1;
  }
  *n_state = (uint32)uVar5;
  return 0;
}

Assistant:

static int32
parse_rem(const char ***attrib,
	  uint32 *tmat,
	  uint32 *state,
	  uint32 *n_state,
	  uint32 n_read)
{
    unsigned int max_n_state;
    uint32 i;
    char *tok;

    *attrib = mk_attrib_list(strtok(NULL, " \t"));

    *tmat = atoi(strtok(NULL, " \t"));

    max_n_state = *n_state;

    for (i = 0; (i < max_n_state) && (tok = strtok(NULL, " \t")); i++) {
	if (tok[0] != 'N')
	    state[i] = atoi(tok);
	else
	    state[i] = TYING_NON_EMITTING;
    }
    
    if (i <= max_n_state)
	*n_state = i;
    else {
	fflush(stdout);
	fprintf(stderr, "%s(%d): number of states for phone exceeds max, %d at line %d\n",
		__FILE__, __LINE__,
		max_n_state, n_read);
	fflush(stderr);
	
	return S3_ERROR;
    }

    return S3_SUCCESS;
}